

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcEco.c
# Opt level: O2

void Bmc_EcoMiterTest(void)

{
  int Entry;
  FILE *pFVar1;
  Gia_Man_t *pGold;
  Gia_Man_t *pGVar2;
  Vec_Int_t *vFans;
  Gia_Obj_t *pObj;
  int iVar3;
  char *pcVar4;
  
  pFVar1 = fopen("eco_gold.aig","r");
  if (pFVar1 == (FILE *)0x0) {
    pcVar4 = "eco_gold.aig";
  }
  else {
    fclose(pFVar1);
    pFVar1 = fopen("eco_old.aig","r");
    if (pFVar1 != (FILE *)0x0) {
      fclose(pFVar1);
      pGold = Gia_AigerRead("eco_gold.aig",0,0,0);
      pGVar2 = Gia_AigerRead("eco_old.aig",0,0,0);
      vFans = Vec_IntAlloc(pGVar2->vCis->nSize);
      for (iVar3 = 0; iVar3 < pGVar2->vCis->nSize; iVar3 = iVar3 + 1) {
        pObj = Gia_ManCi(pGVar2,iVar3);
        if (pObj == (Gia_Obj_t *)0x0) break;
        Entry = Gia_ObjId(pGVar2,pObj);
        Vec_IntPush(vFans,Entry);
      }
      pGVar2 = Bmc_EcoMiter(pGold,pGVar2,vFans);
      Vec_IntFree(vFans);
      Gia_AigerWrite(pGVar2,"eco_miter.aig",0,0);
      iVar3 = Bmc_EcoPatch(pGVar2,pGold->vCis->nSize,pGold->vCos->nSize);
      puts(&DAT_007bb700 + *(int *)(&DAT_007bb704 + (long)iVar3 * 4));
      Gia_ManStop(pGVar2);
      return;
    }
    pcVar4 = "eco_old.aig";
  }
  printf("File \"%s\" does not exist.\n",pcVar4);
  return;
}

Assistant:

void Bmc_EcoMiterTest()
{
    char * pFileGold = "eco_gold.aig";
    char * pFileOld =  "eco_old.aig";
    Vec_Int_t * vFans;
    FILE * pFile;
    Gia_Man_t * pMiter;
    Gia_Obj_t * pObj;
    Gia_Man_t * pGold;
    Gia_Man_t * pOld;
    int i, RetValue;
    // check that the files exist
    pFile = fopen( pFileGold, "r" );
    if ( pFile == NULL )
    {
        printf( "File \"%s\" does not exist.\n", pFileGold );
        return;
    }
    fclose( pFile );
    pFile = fopen( pFileOld, "r" );
    if ( pFile == NULL )
    {
        printf( "File \"%s\" does not exist.\n", pFileOld );
        return;
    }
    fclose( pFile );
    // read files
    pGold = Gia_AigerRead( pFileGold, 0, 0, 0 );
    pOld  = Gia_AigerRead( pFileOld, 0, 0, 0 );
    // create ECO miter
    vFans = Vec_IntAlloc( Gia_ManCiNum(pOld) );
    Gia_ManForEachCi( pOld, pObj, i )
        Vec_IntPush( vFans, Gia_ObjId(pOld, pObj) );
    pMiter = Bmc_EcoMiter( pGold, pOld, vFans );
    Vec_IntFree( vFans );
    Gia_AigerWrite( pMiter, "eco_miter.aig", 0, 0 );
    // find the patch
    RetValue = Bmc_EcoPatch( pMiter, Gia_ManCiNum(pGold), Gia_ManCoNum(pGold) );
    if ( RetValue == 1 )
        printf( "Patch is computed.\n" );
    if ( RetValue == 0 )
        printf( "Cannot be patched.\n" );
    if ( RetValue == -1 )
        printf( "Resource limit exceeded.\n" );
    Gia_ManStop( pMiter );
}